

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parsenumber.cpp
# Opt level: O2

NumberType ICM::Parser::parseNumber(char *ptr,uint64_t *value)

{
  ulong uVar1;
  char cVar2;
  bool bVar3;
  bool bVar4;
  NumberType NVar5;
  int iVar6;
  unsigned_long_long uVar7;
  Format format;
  string *this;
  __shared_count<(__gnu_cxx::_Lock_policy)2> *this_00;
  bool minus;
  Format FVar8;
  char *pcVar9;
  longdouble lVar10;
  allocator local_e9;
  char *end;
  string local_e0;
  allocator local_b9;
  charptr front;
  charptr cp;
  int64_t result2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_60;
  unsigned_long_long local_58;
  double local_50;
  int64_t local_48;
  longdouble local_3c;
  
  cVar2 = *ptr;
  minus = false;
  bVar4 = false;
  if (cVar2 == '+') {
LAB_0013c1a6:
    minus = bVar4;
    cVar2 = ptr[1];
    ptr = ptr + 1;
  }
  else if (cVar2 == '-') {
    bVar4 = true;
    goto LAB_0013c1a6;
  }
  format = f_dec;
  bVar4 = true;
  if (cVar2 == '0') {
    cVar2 = ptr[1];
    if (cVar2 == '.') {
      bVar4 = checkBehindNumber(ptr + 2,10,(char **)0x0);
      if (!bVar4) {
        return nt_unknown;
      }
      std::__cxx11::string::string((string *)&local_e0,ptr,(allocator *)&front);
      NVar5 = parseFloat(&local_e0,value,minus);
      goto LAB_0013c240;
    }
    if (cVar2 == 'x') {
      format = f_hex;
    }
    else {
      if (cVar2 == 'd') {
        ptr = ptr + 2;
        goto LAB_0013c1f9;
      }
      if (cVar2 == 'o') {
        format = f_oct;
      }
      else {
        if (cVar2 != 'b') {
          return nt_unknown;
        }
        format = f_bin;
      }
    }
    ptr = ptr + 2;
    bVar4 = false;
  }
LAB_0013c1f9:
  bVar3 = judgeCharNumber(*ptr,format);
  if (!bVar3) {
    return nt_unknown;
  }
  bVar3 = checkBehindNumber(ptr,format,&end);
  if (bVar3) {
    std::__cxx11::string::string((string *)&local_e0,ptr,(allocator *)&front);
    NVar5 = parseInteger(&local_e0,value,minus,format);
LAB_0013c240:
    std::__cxx11::string::~string((string *)&local_e0);
    return NVar5;
  }
  cVar2 = *end;
  if (cVar2 == '.') {
    end = end + 1;
    Common::charptr::charptr((charptr *)&result2,ptr,end);
    pcVar9 = end;
    NVar5 = nt_unknown;
    bVar4 = checkBehindNumber(end,format,(char **)0x0);
    if (bVar4) {
      Common::charptr::to_string_abi_cxx11_((string *)&front,(charptr *)&result2);
      std::__cxx11::string::string((string *)&cp,pcVar9,&local_b9);
      std::__cxx11::string::string((string *)&local_e0,(char *)front._capacity,&local_e9);
      uVar7 = std::__cxx11::stoull(&local_e0,(size_t *)0x0,format);
      std::__cxx11::string::~string((string *)&local_e0);
      lVar10 = (longdouble)0;
      FVar8 = format;
      for (; *(char *)cp._capacity != '\0'; cp._capacity = cp._capacity + 1) {
        local_3c = lVar10;
        iVar6 = convertChar(*(char *)cp._capacity);
        if ((int)format <= iVar6) {
          __assert_fail("v < base",
                        "/workspace/llm4binary/github/license_all_cmakelists_1510/Chill-Language[P]ICM/source/parser/parsenumber.cpp"
                        ,0x34,"long double ICM::Parser::convertFloatPointBehind(const char *, int)")
          ;
        }
        local_50 = (double)iVar6 / (double)(int)FVar8;
        lVar10 = local_3c + (longdouble)local_50;
        FVar8 = FVar8 * format;
      }
      lVar10 = (longdouble)(long)uVar7 +
               (longdouble)*(float *)(&DAT_0014d790 + (ulong)((long)uVar7 < 0) * 4) + lVar10;
      if (minus != false) {
        lVar10 = -lVar10;
      }
      *(longdouble *)value = lVar10;
      local_58 = uVar7;
      NVar5 = getLimitTypeFloat(value);
      std::__cxx11::string::~string((string *)&cp);
      std::__cxx11::string::~string((string *)&front);
    }
    this_00 = &local_60;
    goto LAB_0013c654;
  }
  if ((cVar2 == 'E') || (cVar2 == 'e')) {
    if (!bVar4) {
      return nt_unknown;
    }
    NVar5 = (NumberType)(byte)end[1];
    if (end[1] == 0) {
      return NVar5;
    }
    if ((NVar5 == 0x2d) || (pcVar9 = end + 1, NVar5 == 0x2b)) {
      pcVar9 = end + 2;
    }
    while (end = pcVar9, cVar2 = *end, (int)cVar2 - 0x30U < 10) {
      pcVar9 = end + 1;
    }
    if (cVar2 == '\0') {
      std::__cxx11::string::string((string *)&local_e0,ptr,(allocator *)&front);
      NVar5 = parseFloat(&local_e0,value,minus);
      goto LAB_0013c240;
    }
    if ((cVar2 != '-') && (cVar2 != '+')) {
      return nt_unknown;
    }
    Common::charptr::charptr(&front,ptr,end);
    Common::charptr::to_string_abi_cxx11_(&local_e0,&front);
    parseFloat(&local_e0,&cp._capacity,minus);
    std::__cxx11::string::~string((string *)&local_e0);
    NVar5 = nt_unknown;
    if ((int)end[1] - 0x30U < 10) {
      cVar2 = *end;
      pcVar9 = end + 1;
      NVar5 = nt_unknown;
      bVar4 = checkBehindNumber(pcVar9,10,(char **)0x0);
      if (bVar4) {
        std::__cxx11::string::string((string *)&local_e0,pcVar9,&local_e9);
        parseInteger(&local_e0,(uint64_t *)&result2,cVar2 == '-',f_dec);
        std::__cxx11::string::~string((string *)&local_e0);
        local_48 = result2;
        *(longdouble *)value =
             (longdouble)result2 +
             (longdouble)
             CONCAT28(cp._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_ptr._0_2_,
                      cp._capacity);
        NVar5 = getLimitTypeFloat(value);
      }
    }
    this_00 = &front._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
    goto LAB_0013c654;
  }
  if ((cVar2 != 'u') && (cVar2 != 'i')) {
    return nt_unknown;
  }
  Common::charptr::charptr(&cp,ptr,end);
  if (*end == 'i') {
    Common::charptr::to_string_abi_cxx11_(&local_e0,&cp);
    NVar5 = parseInteger(&local_e0,value,minus,format);
    this = &local_e0;
LAB_0013c64a:
    std::__cxx11::string::~string((string *)this);
  }
  else {
    NVar5 = nt_unknown;
    if (minus == false) {
      Common::charptr::to_string_abi_cxx11_((string *)&front,&cp);
      std::__cxx11::string::string
                ((string *)&local_e0,(char *)front._capacity,(allocator *)&result2);
      uVar7 = std::__cxx11::stoull(&local_e0,(size_t *)0x0,format);
      *value = uVar7;
      std::__cxx11::string::~string((string *)&local_e0);
      uVar1 = *value;
      if (uVar1 >> 0x20 == 0) {
        if (uVar1 < 0x10000) {
          NVar5 = nt_uint16 - (uVar1 < 0x100);
        }
        else {
          NVar5 = nt_uint32;
        }
      }
      else {
        NVar5 = nt_uint64;
      }
      this = (string *)&front;
      goto LAB_0013c64a;
    }
  }
  this_00 = &cp._data.super___shared_ptr<char,_(__gnu_cxx::_Lock_policy)2>._M_refcount;
LAB_0013c654:
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(this_00);
  return NVar5;
}

Assistant:

NumberType parseNumber(const char *ptr, uint64_t &value)
		{
			bool minus = false;

			Format format = f_dec;

			if (*ptr == '+') {
				ptr++;
			}
			else if (*ptr == '-') {
				minus = true;
				ptr++;
			}

			if (*ptr == '0') {
				ptr++;
				switch (*ptr) {
				case 'b': format = f_bin; ptr++; break;
				case 'o': format = f_oct; ptr++; break;
				case 'd': format = f_dec; ptr++; break;
				case 'x': format = f_hex; ptr++; break;
				case '.':
					// Include : 0. -> 0.0
					return checkBehindNumber(ptr + 1, format) ? parseFloat(ptr - 1, value, minus) : nt_unknown;
				default: return nt_unknown;
				}
			}

			if (!judgeCharNumber(*ptr, format))
				return nt_unknown;

			const char *end;
			if (checkBehindNumber(ptr, format, &end)) {
				return parseInteger(ptr, value, minus, format);
			}
			else {
				if (*end == 'i' || *end == 'u') {
					charptr cp(ptr, end);

					if (*end == 'i') {
						return parseInteger(cp.to_string(), value, minus, format);
					}
					else {
						if (minus) return nt_unknown;

						return parseUnsigned(cp.to_string(), value, format);
					}
				}

				if (*end == '.') {
					end++;
					charptr front(ptr, end);
					ptr = end;

					// Include the number : XXX. -> XXX.0
					if (*ptr == '\0') (void)0;

					if (!checkBehindNumber(ptr, format))
						return nt_unknown;

					return parseFloat(front.to_string(), ptr, value, minus, format);
				}

				if (*end == 'e' || *end == 'E') {
					if (format != f_dec)
						return nt_unknown;

					end++;
					if (*end == '\0')
						return nt_unknown;

					if (*end == '+' || *end == '-') {
						end++;
					}
					while (isdigit(*end)) {
						end++;
					}
					if (*end == '+' || *end == '-') {
						charptr front(ptr, end);
						long double result1;
						parseFloat(front.to_string(), (uint64_t&)result1, minus);

						minus = *end == '-';
						ptr = end + 1;
						if (!isdigit(*ptr))
							return nt_unknown;

						if (!checkBehindNumber(ptr, format))
							return nt_unknown;

						int64_t result2;
						parseInteger(ptr, (uint64_t&)result2, minus, f_dec);

						(long double&)value = result1 + (long double)result2;
						return getLimitTypeFloat(value);
					}
					if (*end != '\0')
						return nt_unknown;

					return parseFloat(ptr, value, minus);
				}
			}

			return nt_unknown;
		}